

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

uint * fetchTransformedBilinear<(TextureBlendType)5,(QPixelLayout::BPP)6>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  anon_union_80_2_ea1780ee_for_QSpanData_24 *image;
  ulong uVar1;
  Format FVar2;
  long lVar3;
  QList<unsigned_int> *pQVar4;
  double dVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  unkuint9 Var31;
  undefined1 auVar32 [11];
  undefined1 auVar33 [13];
  undefined1 auVar34 [15];
  unkuint9 Var35;
  undefined1 auVar36 [11];
  undefined1 auVar37 [13];
  undefined1 auVar38 [15];
  undefined1 auVar39 [11];
  undefined1 auVar40 [13];
  undefined1 auVar41 [15];
  undefined1 auVar42 [11];
  undefined1 auVar43 [13];
  undefined1 auVar44 [14];
  undefined1 auVar45 [12];
  unkbyte10 Var46;
  undefined1 auVar47 [14];
  undefined1 auVar48 [12];
  unkbyte10 Var49;
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  uint fdx;
  uint uVar58;
  int len;
  ulong uVar59;
  ulong uVar60;
  uint *puVar61;
  uint uVar62;
  uint uVar63;
  int iVar64;
  ulong uVar65;
  long in_FS_OFFSET;
  short sVar66;
  short sVar86;
  double dVar67;
  double dVar68;
  undefined1 auVar69 [12];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  byte bVar87;
  undefined1 auVar70 [12];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar85 [16];
  double dVar88;
  undefined1 auVar89 [12];
  undefined1 auVar90 [16];
  byte bVar103;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  short sVar104;
  short sVar107;
  double dVar105;
  undefined1 auVar106 [16];
  ushort uVar108;
  ushort uVar110;
  double dVar109;
  undefined1 uVar111;
  undefined1 uVar112;
  undefined1 uVar113;
  undefined1 uVar114;
  undefined1 uVar115;
  undefined1 uVar116;
  undefined1 uVar117;
  undefined1 uVar118;
  double dVar119;
  double dVar120;
  int in_stack_ffffffffffffaef8;
  short local_50d8;
  short sStack_50d6;
  qreal fw;
  qreal fy;
  qreal fx;
  ushort distys [1024];
  ushort distxs [1024];
  uint buf2 [2048];
  uint buf1 [2048];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar73 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  image = &data->field_23;
  FVar2 = (data->field_23).texture.format;
  pQVar4 = (data->field_23).texture.colorTable;
  dVar5 = (double)x + 0.5;
  dVar109 = (double)y + 0.5;
  if ((data->field_0x8a & 1) != 0) {
    dVar68 = data->m12;
    dVar119 = (dVar109 * data->m21 + dVar5 * data->m11 + data->dx) * 65536.0;
    dVar120 = (dVar109 * data->m22 + dVar5 * dVar68 + data->dy) * 65536.0;
    dVar88 = dVar120;
    if (dVar119 <= dVar120) {
      dVar88 = dVar119;
    }
    dVar67 = trunc(data->m11 * 65536.0);
    dVar68 = trunc(dVar68 * 65536.0);
    dVar105 = (double)length * dVar67 + dVar119;
    dVar67 = (double)length * dVar68 + dVar120;
    dVar68 = dVar67;
    if (dVar105 <= dVar67) {
      dVar68 = dVar105;
    }
    if (dVar88 <= dVar68) {
      dVar68 = dVar88;
    }
    if (-2147483648.0 <= dVar68) {
      if (dVar120 <= dVar119) {
        dVar120 = dVar119;
      }
      if (dVar67 <= dVar105) {
        dVar67 = dVar105;
      }
      if (dVar67 <= dVar120) {
        dVar67 = dVar120;
      }
      if (dVar67 <= 2147483647.0) {
        fdx = (uint)(data->m11 * 65536.0);
        dVar68 = dVar5 * data->m12;
        uVar111 = SUB81(dVar68,0);
        uVar112 = (undefined1)((ulong)dVar68 >> 8);
        uVar113 = (undefined1)((ulong)dVar68 >> 0x10);
        uVar114 = (undefined1)((ulong)dVar68 >> 0x18);
        uVar115 = (undefined1)((ulong)dVar68 >> 0x20);
        uVar116 = (undefined1)((ulong)dVar68 >> 0x28);
        uVar117 = (undefined1)((ulong)dVar68 >> 0x30);
        uVar118 = (undefined1)((ulong)dVar68 >> 0x38);
        iVar64 = (int)(data->m12 * 65536.0);
        distxs._0_4_ = (int)((data->m21 * dVar109 + dVar5 * data->m11 + data->dx) * 65536.0) +
                       -0x8000;
        uVar58 = (int)((dVar109 * data->m22 + dVar68 + data->dy) * 65536.0) - 0x8000;
        distys._0_4_ = uVar58;
        uVar62 = uVar58;
        if (iVar64 != 0) {
          puVar61 = buffer;
          if (length != 0) {
            do {
              uVar65 = 0x400;
              if (length < 0x400) {
                uVar65 = (ulong)(uint)length;
              }
              len = (int)uVar65;
              fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>
                        (buf1,buf2,len,&image->texture,distxs._0_4_,uVar58,fdx,iVar64);
              (*qPixelLayouts[FVar2].convertToARGB32PM)(buf1,len * 2,pQVar4);
              (*qPixelLayouts[FVar2].convertToARGB32PM)(buf2,len * 2,pQVar4);
              if (0 < length) {
                uVar59 = 0;
                do {
                  uVar62 = (uint)distxs._0_4_ >> 8 & 0xff;
                  uVar60 = *(ulong *)(buf1 + uVar59 * 2);
                  uVar1 = *(ulong *)(buf2 + uVar59 * 2);
                  auVar7._8_6_ = 0;
                  auVar7._0_8_ = uVar60;
                  auVar7[0xe] = (char)(uVar60 >> 0x38);
                  auVar9._8_4_ = 0;
                  auVar9._0_8_ = uVar60;
                  auVar9[0xc] = (char)(uVar60 >> 0x30);
                  auVar9._13_2_ = auVar7._13_2_;
                  auVar11._8_4_ = 0;
                  auVar11._0_8_ = uVar60;
                  auVar11._12_3_ = auVar9._12_3_;
                  auVar13._8_2_ = 0;
                  auVar13._0_8_ = uVar60;
                  auVar13[10] = (char)(uVar60 >> 0x28);
                  auVar13._11_4_ = auVar11._11_4_;
                  auVar15._8_2_ = 0;
                  auVar15._0_8_ = uVar60;
                  auVar15._10_5_ = auVar13._10_5_;
                  auVar17[8] = (char)(uVar60 >> 0x20);
                  auVar17._0_8_ = uVar60;
                  auVar17._9_6_ = auVar15._9_6_;
                  auVar30._7_8_ = 0;
                  auVar30._0_7_ = auVar17._8_7_;
                  Var31 = CONCAT81(SUB158(auVar30 << 0x40,7),(char)(uVar60 >> 0x18));
                  auVar50._9_6_ = 0;
                  auVar50._0_9_ = Var31;
                  auVar32._1_10_ = SUB1510(auVar50 << 0x30,5);
                  auVar32[0] = (char)(uVar60 >> 0x10);
                  auVar51._11_4_ = 0;
                  auVar51._0_11_ = auVar32;
                  auVar33._1_12_ = SUB1512(auVar51 << 0x20,3);
                  auVar33[0] = (char)(uVar60 >> 8);
                  auVar6._8_6_ = 0;
                  auVar6._0_8_ = uVar1;
                  auVar6[0xe] = (char)(uVar1 >> 0x38);
                  auVar8._8_4_ = 0;
                  auVar8._0_8_ = uVar1;
                  auVar8[0xc] = (char)(uVar1 >> 0x30);
                  auVar8._13_2_ = auVar6._13_2_;
                  auVar10._8_4_ = 0;
                  auVar10._0_8_ = uVar1;
                  auVar10._12_3_ = auVar8._12_3_;
                  auVar12._8_2_ = 0;
                  auVar12._0_8_ = uVar1;
                  auVar12[10] = (char)(uVar1 >> 0x28);
                  auVar12._11_4_ = auVar10._11_4_;
                  auVar14._8_2_ = 0;
                  auVar14._0_8_ = uVar1;
                  auVar14._10_5_ = auVar12._10_5_;
                  auVar16[8] = (char)(uVar1 >> 0x20);
                  auVar16._0_8_ = uVar1;
                  auVar16._9_6_ = auVar14._9_6_;
                  auVar34._7_8_ = 0;
                  auVar34._0_7_ = auVar16._8_7_;
                  Var35 = CONCAT81(SUB158(auVar34 << 0x40,7),(char)(uVar1 >> 0x18));
                  auVar52._9_6_ = 0;
                  auVar52._0_9_ = Var35;
                  auVar36._1_10_ = SUB1510(auVar52 << 0x30,5);
                  auVar36[0] = (char)(uVar1 >> 0x10);
                  auVar53._11_4_ = 0;
                  auVar53._0_11_ = auVar36;
                  auVar37._1_12_ = SUB1512(auVar53 << 0x20,3);
                  auVar37[0] = (char)(uVar1 >> 8);
                  uVar63 = uVar58 >> 8 & 0xff;
                  auVar106 = pshuflw(ZEXT416(0x100 - uVar63),ZEXT416(0x100 - uVar63),0);
                  sVar104 = auVar106._0_2_;
                  sVar107 = auVar106._2_2_;
                  auVar106 = pshuflw(ZEXT416(uVar63),ZEXT416(uVar63),0);
                  sVar66 = auVar106._0_2_;
                  sVar86 = auVar106._2_2_;
                  auVar77._0_4_ =
                       CONCAT22(sVar86 * auVar37._0_2_ + sVar107 * auVar33._0_2_,
                                sVar66 * (ushort)(byte)uVar1 + sVar104 * (ushort)(byte)uVar60);
                  auVar69._0_8_ =
                       CONCAT26(sVar86 * (short)Var35 + sVar107 * (short)Var31,
                                CONCAT24(sVar66 * auVar36._0_2_ + sVar104 * auVar32._0_2_,
                                         auVar77._0_4_));
                  auVar69._8_2_ = sVar66 * auVar16._8_2_ + sVar104 * auVar17._8_2_;
                  auVar69._10_2_ = sVar86 * auVar12._10_2_ + sVar107 * auVar13._10_2_;
                  auVar106._12_2_ = sVar66 * auVar8._12_2_ + sVar104 * auVar9._12_2_;
                  auVar106._0_12_ = auVar69;
                  auVar106._14_2_ = sVar86 * (auVar6._13_2_ >> 8) + sVar107 * (auVar7._13_2_ >> 8);
                  auVar90._0_4_ = CONCAT22((short)uVar62,(short)(0x100 - uVar62));
                  auVar90._4_4_ = auVar90._0_4_;
                  auVar90._8_4_ = auVar90._0_4_;
                  auVar90._12_4_ = auVar90._0_4_;
                  auVar77._12_4_ = auVar106._12_4_;
                  auVar77._4_4_ = auVar69._8_4_;
                  auVar77._8_4_ = (int)((ulong)auVar69._0_8_ >> 0x20);
                  auVar106 = pshuflw(auVar77,auVar77,0xd8);
                  auVar106 = pshufhw(auVar106,auVar106,0xd8);
                  auVar71._0_2_ = auVar106._0_2_ >> 8;
                  auVar71._2_2_ = auVar106._2_2_ >> 8;
                  auVar71._4_2_ = auVar106._4_2_ >> 8;
                  auVar71._6_2_ = auVar106._6_2_ >> 8;
                  auVar71._8_2_ = auVar106._8_2_ >> 8;
                  auVar71._10_2_ = auVar106._10_2_ >> 8;
                  auVar71._12_2_ = auVar106._12_2_ >> 8;
                  auVar71._14_2_ = auVar106._14_2_ >> 8;
                  auVar106 = pmaddwd(auVar71,auVar90);
                  auVar72._0_4_ = auVar106._0_4_ >> 8;
                  auVar72._4_4_ = auVar106._4_4_ >> 8;
                  auVar72._8_4_ = auVar106._8_4_ >> 8;
                  auVar72._12_4_ = auVar106._12_4_ >> 8;
                  auVar106 = packssdw(auVar72,auVar72);
                  sVar66 = auVar106._0_2_;
                  sVar86 = auVar106._2_2_;
                  sVar104 = auVar106._4_2_;
                  sVar107 = auVar106._6_2_;
                  puVar61[uVar59] =
                       CONCAT13((0 < sVar107) * (sVar107 < 0x100) * auVar106[6] - (0xff < sVar107),
                                CONCAT12((0 < sVar104) * (sVar104 < 0x100) * auVar106[4] -
                                         (0xff < sVar104),
                                         CONCAT11((0 < sVar86) * (sVar86 < 0x100) * auVar106[2] -
                                                  (0xff < sVar86),
                                                  (0 < sVar66) * (sVar66 < 0x100) * auVar106[0] -
                                                  (0xff < sVar66))));
                  distxs._0_4_ = distxs._0_4_ + fdx;
                  uVar58 = uVar58 + iVar64;
                  uVar59 = uVar59 + 1;
                } while (uVar65 != uVar59);
              }
              length = length - len;
              puVar61 = puVar61 + len;
              uVar62 = uVar58;
            } while (length != 0);
          }
          goto LAB_0066f181;
        }
        uVar63 = -fdx;
        if (0 < (int)fdx) {
          uVar63 = fdx;
        }
        puVar61 = buffer;
        if (0x10000 < uVar63) {
          if (0x20000 < uVar63) {
            if (length != 0) {
              auVar106 = ZEXT416(0x100 - (uVar58 >> 8 & 0xff));
              auVar106 = pshuflw(auVar106,auVar106,0);
              auVar77 = pshuflw(ZEXT416(uVar58),ZEXT416(uVar58),0);
              uVar108 = auVar77._0_2_;
              uVar110 = auVar77._2_2_;
              local_50d8 = auVar106._0_2_;
              sStack_50d6 = auVar106._2_2_;
              do {
                uVar65 = 0x400;
                if (length < 0x400) {
                  uVar65 = (ulong)(uint)length;
                }
                iVar64 = (int)uVar65;
                fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>
                          (buf1,buf2,iVar64,&image->texture,distxs._0_4_,uVar58,fdx,0);
                (*qPixelLayouts[FVar2].convertToARGB32PM)(buf1,iVar64 * 2,pQVar4);
                (*qPixelLayouts[FVar2].convertToARGB32PM)(buf2,iVar64 * 2,pQVar4);
                if (0 < length) {
                  uVar60 = 0;
                  uVar59 = CONCAT17(uVar118,CONCAT16(uVar117,CONCAT15(uVar116,CONCAT14(uVar115,
                                                  CONCAT13(uVar114,CONCAT12(uVar113,CONCAT11(uVar112
                                                  ,uVar111))))))) ^
                           CONCAT17(uVar118,CONCAT16(uVar117,CONCAT15(uVar116,CONCAT14(uVar115,
                                                  CONCAT13(uVar114,CONCAT12(uVar113,CONCAT11(uVar112
                                                  ,uVar111)))))));
                  uVar111 = (undefined1)uVar59;
                  uVar112 = (undefined1)(uVar59 >> 8);
                  uVar113 = (undefined1)(uVar59 >> 0x10);
                  uVar114 = (undefined1)(uVar59 >> 0x18);
                  uVar115 = (undefined1)(uVar59 >> 0x20);
                  uVar116 = (undefined1)(uVar59 >> 0x28);
                  uVar117 = (undefined1)(uVar59 >> 0x30);
                  uVar118 = (undefined1)(uVar59 >> 0x38);
                  do {
                    uVar62 = (uint)distxs._0_4_ >> 8 & 0xff;
                    uVar59 = *(ulong *)(buf1 + uVar60 * 2);
                    uVar1 = *(ulong *)(buf2 + uVar60 * 2);
                    auVar84._8_6_ = 0;
                    auVar84._0_8_ = uVar59;
                    auVar84[0xe] = (char)(uVar59 >> 0x38);
                    auVar84[0xf] = uVar118;
                    auVar83._14_2_ = auVar84._14_2_;
                    auVar83._8_5_ = 0;
                    auVar83._0_8_ = uVar59;
                    auVar83[0xd] = uVar117;
                    auVar82._13_3_ = auVar83._13_3_;
                    auVar82._8_4_ = 0;
                    auVar82._0_8_ = uVar59;
                    auVar82[0xc] = (char)(uVar59 >> 0x30);
                    auVar81._12_4_ = auVar82._12_4_;
                    auVar81._8_3_ = 0;
                    auVar81._0_8_ = uVar59;
                    auVar81[0xb] = uVar116;
                    auVar80._11_5_ = auVar81._11_5_;
                    auVar80._8_2_ = 0;
                    auVar80._0_8_ = uVar59;
                    auVar80[10] = (char)(uVar59 >> 0x28);
                    auVar79._10_6_ = auVar80._10_6_;
                    auVar79[8] = 0;
                    auVar79._0_8_ = uVar59;
                    auVar79[9] = uVar115;
                    auVar78._9_7_ = auVar79._9_7_;
                    auVar78[8] = (char)(uVar59 >> 0x20);
                    auVar78._0_8_ = uVar59;
                    Var46 = CONCAT91(CONCAT81(auVar78._8_8_,uVar114),(char)(uVar59 >> 0x18));
                    auVar45._2_10_ = Var46;
                    auVar45[1] = uVar113;
                    auVar45[0] = (char)(uVar59 >> 0x10);
                    auVar44._2_12_ = auVar45;
                    auVar44[1] = uVar112;
                    auVar44[0] = (char)(uVar59 >> 8);
                    auVar98._8_6_ = 0;
                    auVar98._0_8_ = uVar1;
                    auVar98[0xe] = (char)(uVar1 >> 0x38);
                    auVar98[0xf] = uVar118;
                    auVar97._14_2_ = auVar98._14_2_;
                    auVar97._8_5_ = 0;
                    auVar97._0_8_ = uVar1;
                    auVar97[0xd] = uVar117;
                    auVar96._13_3_ = auVar97._13_3_;
                    auVar96._8_4_ = 0;
                    auVar96._0_8_ = uVar1;
                    auVar96[0xc] = (char)(uVar1 >> 0x30);
                    auVar95._12_4_ = auVar96._12_4_;
                    auVar95._8_3_ = 0;
                    auVar95._0_8_ = uVar1;
                    auVar95[0xb] = uVar116;
                    auVar94._11_5_ = auVar95._11_5_;
                    auVar94._8_2_ = 0;
                    auVar94._0_8_ = uVar1;
                    auVar94[10] = (char)(uVar1 >> 0x28);
                    auVar93._10_6_ = auVar94._10_6_;
                    auVar93[8] = 0;
                    auVar93._0_8_ = uVar1;
                    auVar93[9] = uVar115;
                    auVar92._9_7_ = auVar93._9_7_;
                    auVar92[8] = (char)(uVar1 >> 0x20);
                    auVar92._0_8_ = uVar1;
                    Var49 = CONCAT91(CONCAT81(auVar92._8_8_,uVar114),(char)(uVar1 >> 0x18));
                    auVar48._2_10_ = Var49;
                    auVar48[1] = uVar113;
                    auVar48[0] = (char)(uVar1 >> 0x10);
                    auVar47._2_12_ = auVar48;
                    auVar47[1] = uVar112;
                    auVar47[0] = (char)(uVar1 >> 8);
                    auVar100._0_4_ =
                         CONCAT22(auVar47._0_2_ * (uVar110 >> 8) + auVar44._0_2_ * sStack_50d6,
                                  CONCAT11(uVar111,(char)uVar1) * (uVar108 >> 8) +
                                  CONCAT11(uVar111,(char)uVar59) * local_50d8);
                    auVar89._0_8_ =
                         CONCAT26((short)Var49 * (uVar110 >> 8) + (short)Var46 * sStack_50d6,
                                  CONCAT24(auVar48._0_2_ * (uVar108 >> 8) +
                                           auVar45._0_2_ * local_50d8,auVar100._0_4_));
                    auVar89._8_2_ = auVar92._8_2_ * (uVar108 >> 8) + auVar78._8_2_ * local_50d8;
                    auVar89._10_2_ = auVar94._10_2_ * (uVar110 >> 8) + auVar80._10_2_ * sStack_50d6;
                    auVar99._12_2_ = auVar96._12_2_ * (uVar108 >> 8) + auVar82._12_2_ * local_50d8;
                    auVar99._0_12_ = auVar89;
                    auVar99._14_2_ = auVar97._14_2_ * (uVar110 >> 8) + auVar83._14_2_ * sStack_50d6;
                    auVar85._0_4_ = CONCAT22((short)uVar62,(short)(0x100 - uVar62));
                    auVar85._4_4_ = auVar85._0_4_;
                    auVar85._8_4_ = auVar85._0_4_;
                    auVar85._12_4_ = auVar85._0_4_;
                    auVar100._12_4_ = auVar99._12_4_;
                    auVar100._4_4_ = auVar89._8_4_;
                    auVar100._8_4_ = (int)((ulong)auVar89._0_8_ >> 0x20);
                    auVar106 = pshuflw(auVar100,auVar100,0xd8);
                    auVar106 = pshufhw(auVar106,auVar106,0xd8);
                    auVar101._0_2_ = auVar106._0_2_ >> 8;
                    auVar101._2_2_ = auVar106._2_2_ >> 8;
                    auVar101._4_2_ = auVar106._4_2_ >> 8;
                    auVar101._6_2_ = auVar106._6_2_ >> 8;
                    auVar101._8_2_ = auVar106._8_2_ >> 8;
                    auVar101._10_2_ = auVar106._10_2_ >> 8;
                    auVar101._12_2_ = auVar106._12_2_ >> 8;
                    auVar101._14_2_ = auVar106._14_2_ >> 8;
                    auVar106 = pmaddwd(auVar101,auVar85);
                    auVar102._0_4_ = auVar106._0_4_ >> 8;
                    auVar102._4_4_ = auVar106._4_4_ >> 8;
                    auVar102._8_4_ = auVar106._8_4_ >> 8;
                    auVar102._12_4_ = auVar106._12_4_ >> 8;
                    auVar106 = packssdw(auVar102,auVar102);
                    sVar66 = auVar106._0_2_;
                    sVar86 = auVar106._2_2_;
                    sVar104 = auVar106._4_2_;
                    sVar107 = auVar106._6_2_;
                    puVar61[uVar60] =
                         CONCAT13((0 < sVar107) * (sVar107 < 0x100) * auVar106[6] - (0xff < sVar107)
                                  ,CONCAT12((0 < sVar104) * (sVar104 < 0x100) * auVar106[4] -
                                            (0xff < sVar104),
                                            CONCAT11((0 < sVar86) * (sVar86 < 0x100) * auVar106[2] -
                                                     (0xff < sVar86),
                                                     (0 < sVar66) * (sVar66 < 0x100) * auVar106[0] -
                                                     (0xff < sVar66))));
                    distxs._0_4_ = distxs._0_4_ + fdx;
                    uVar60 = uVar60 + 1;
                  } while (uVar65 != uVar60);
                }
                puVar61 = puVar61 + iVar64;
                length = length - iVar64;
                uVar62 = distys._0_4_;
              } while (length != 0);
            }
            goto LAB_0066f181;
          }
          uVar58 = length + 1U >> 1;
          if (length < 0x400) {
            uVar58 = length;
          }
          fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                    (buffer,buffer + (int)uVar58,&image->texture,(int *)distxs,(int *)distys,fdx,
                     in_stack_ffffffffffffaef8);
          puVar61 = buffer + (int)uVar58;
          uVar62 = distys._0_4_;
          if (uVar58 == length) goto LAB_0066f181;
        }
        fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                  (puVar61,buffer + length,&image->texture,(int *)distxs,(int *)distys,fdx,
                   in_stack_ffffffffffffaef8);
        uVar62 = distys._0_4_;
        goto LAB_0066f181;
      }
    }
  }
  dVar68 = data->m11;
  dVar120 = data->m12;
  dVar88 = data->m13;
  fx = data->m21 * dVar109 + dVar5 * dVar68 + data->dx;
  fy = data->m22 * dVar109 + dVar5 * dVar120 + data->dy;
  fw = dVar109 * data->m23 + dVar5 * dVar88 + data->m33;
  puVar61 = buffer;
  uVar62 = distys._0_4_;
  if (length != 0) {
    do {
      uVar65 = 0x400;
      if (length < 0x400) {
        uVar65 = (ulong)(uint)length;
      }
      iVar64 = (int)uVar65;
      fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>
                (buf1,buf2,distxs,distys,iVar64,&image->texture,&fx,&fy,&fw,dVar68,dVar120,dVar88);
      (*qPixelLayouts[FVar2].convertToARGB32PM)(buf1,iVar64 * 2,pQVar4);
      (*qPixelLayouts[FVar2].convertToARGB32PM)(buf2,iVar64 * 2,pQVar4);
      if (0 < length) {
        uVar59 = 0;
        do {
          uVar60 = *(ulong *)(buf1 + uVar59 * 2);
          uVar1 = *(ulong *)(buf2 + uVar59 * 2);
          bVar87 = (byte)(uVar60 >> 0x38);
          auVar19._8_6_ = 0;
          auVar19._0_8_ = uVar60;
          auVar19[0xe] = bVar87;
          auVar21._8_4_ = 0;
          auVar21._0_8_ = uVar60;
          auVar21[0xc] = (char)(uVar60 >> 0x30);
          auVar21._13_2_ = auVar19._13_2_;
          auVar23._8_4_ = 0;
          auVar23._0_8_ = uVar60;
          auVar23._12_3_ = auVar21._12_3_;
          auVar25._8_2_ = 0;
          auVar25._0_8_ = uVar60;
          auVar25[10] = (char)(uVar60 >> 0x28);
          auVar25._11_4_ = auVar23._11_4_;
          auVar27._8_2_ = 0;
          auVar27._0_8_ = uVar60;
          auVar27._10_5_ = auVar25._10_5_;
          auVar29[8] = (char)(uVar60 >> 0x20);
          auVar29._0_8_ = uVar60;
          auVar29._9_6_ = auVar27._9_6_;
          auVar38._7_8_ = 0;
          auVar38._0_7_ = auVar29._8_7_;
          Var31 = CONCAT81(SUB158(auVar38 << 0x40,7),(char)(uVar60 >> 0x18));
          auVar54._9_6_ = 0;
          auVar54._0_9_ = Var31;
          auVar39._1_10_ = SUB1510(auVar54 << 0x30,5);
          auVar39[0] = (char)(uVar60 >> 0x10);
          auVar55._11_4_ = 0;
          auVar55._0_11_ = auVar39;
          auVar40._1_12_ = SUB1512(auVar55 << 0x20,3);
          auVar40[0] = (char)(uVar60 >> 8);
          bVar103 = (byte)(uVar1 >> 0x38);
          auVar18._8_6_ = 0;
          auVar18._0_8_ = uVar1;
          auVar18[0xe] = bVar103;
          auVar20._8_4_ = 0;
          auVar20._0_8_ = uVar1;
          auVar20[0xc] = (char)(uVar1 >> 0x30);
          auVar20._13_2_ = auVar18._13_2_;
          auVar22._8_4_ = 0;
          auVar22._0_8_ = uVar1;
          auVar22._12_3_ = auVar20._12_3_;
          auVar24._8_2_ = 0;
          auVar24._0_8_ = uVar1;
          auVar24[10] = (char)(uVar1 >> 0x28);
          auVar24._11_4_ = auVar22._11_4_;
          auVar26._8_2_ = 0;
          auVar26._0_8_ = uVar1;
          auVar26._10_5_ = auVar24._10_5_;
          auVar28[8] = (char)(uVar1 >> 0x20);
          auVar28._0_8_ = uVar1;
          auVar28._9_6_ = auVar26._9_6_;
          auVar41._7_8_ = 0;
          auVar41._0_7_ = auVar28._8_7_;
          Var35 = CONCAT81(SUB158(auVar41 << 0x40,7),(char)(uVar1 >> 0x18));
          auVar56._9_6_ = 0;
          auVar56._0_9_ = Var35;
          auVar42._1_10_ = SUB1510(auVar56 << 0x30,5);
          auVar42[0] = (char)(uVar1 >> 0x10);
          auVar57._11_4_ = 0;
          auVar57._0_11_ = auVar42;
          auVar43._1_12_ = SUB1512(auVar57 << 0x20,3);
          auVar43[0] = (char)(uVar1 >> 8);
          uVar62 = (uint)*(byte *)((long)distys + uVar59 * 2 + 1);
          auVar106 = pshuflw(ZEXT416(0x100 - uVar62),ZEXT416(0x100 - uVar62),0);
          sVar104 = auVar106._0_2_;
          sVar107 = auVar106._2_2_;
          auVar106 = pshuflw(ZEXT416(uVar62),ZEXT416(uVar62),0);
          sVar66 = auVar106._0_2_;
          sVar86 = auVar106._2_2_;
          auVar74._0_4_ =
               CONCAT22(sVar86 * auVar43._0_2_ + sVar107 * auVar40._0_2_,
                        sVar66 * (ushort)(byte)uVar1 + sVar104 * (ushort)(byte)uVar60);
          auVar70._0_8_ =
               CONCAT26(sVar86 * (short)Var35 + sVar107 * (short)Var31,
                        CONCAT24(sVar66 * auVar42._0_2_ + sVar104 * auVar39._0_2_,auVar74._0_4_));
          auVar70._8_2_ = sVar66 * auVar28._8_2_ + sVar104 * auVar29._8_2_;
          auVar70._10_2_ = sVar86 * auVar24._10_2_ + sVar107 * auVar25._10_2_;
          auVar73._12_2_ = sVar66 * auVar20._12_2_ + sVar104 * auVar21._12_2_;
          auVar73._0_12_ = auVar70;
          auVar73._14_2_ = sVar86 * (ushort)bVar103 + sVar107 * (ushort)bVar87;
          auVar91._0_4_ = CONCAT22(distxs[uVar59] >> 8,0x100 - (distxs[uVar59] >> 8));
          auVar91._4_4_ = auVar91._0_4_;
          auVar91._8_4_ = auVar91._0_4_;
          auVar91._12_4_ = auVar91._0_4_;
          auVar74._12_4_ = auVar73._12_4_;
          auVar74._4_4_ = auVar70._8_4_;
          auVar74._8_4_ = (int)((ulong)auVar70._0_8_ >> 0x20);
          auVar106 = pshuflw(auVar74,auVar74,0xd8);
          auVar106 = pshufhw(auVar106,auVar106,0xd8);
          auVar75._0_2_ = auVar106._0_2_ >> 8;
          auVar75._2_2_ = auVar106._2_2_ >> 8;
          auVar75._4_2_ = auVar106._4_2_ >> 8;
          auVar75._6_2_ = auVar106._6_2_ >> 8;
          auVar75._8_2_ = auVar106._8_2_ >> 8;
          auVar75._10_2_ = auVar106._10_2_ >> 8;
          auVar75._12_2_ = auVar106._12_2_ >> 8;
          auVar75._14_2_ = auVar106._14_2_ >> 8;
          auVar106 = pmaddwd(auVar75,auVar91);
          auVar76._0_4_ = auVar106._0_4_ >> 8;
          auVar76._4_4_ = auVar106._4_4_ >> 8;
          auVar76._8_4_ = auVar106._8_4_ >> 8;
          auVar76._12_4_ = auVar106._12_4_ >> 8;
          auVar106 = packssdw(auVar76,auVar76);
          sVar66 = auVar106._0_2_;
          sVar86 = auVar106._2_2_;
          sVar104 = auVar106._4_2_;
          sVar107 = auVar106._6_2_;
          puVar61[uVar59] =
               CONCAT13((0 < sVar107) * (sVar107 < 0x100) * auVar106[6] - (0xff < sVar107),
                        CONCAT12((0 < sVar104) * (sVar104 < 0x100) * auVar106[4] - (0xff < sVar104),
                                 CONCAT11((0 < sVar86) * (sVar86 < 0x100) * auVar106[2] -
                                          (0xff < sVar86),
                                          (0 < sVar66) * (sVar66 < 0x100) * auVar106[0] -
                                          (0xff < sVar66))));
          uVar59 = uVar59 + 1;
        } while (uVar65 != uVar59);
      }
      length = length - iVar64;
      puVar61 = puVar61 + iVar64;
      uVar62 = distys._0_4_;
    } while (length != 0);
  }
LAB_0066f181:
  distys._0_4_ = uVar62;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return buffer;
}

Assistant:

static const uint *QT_FASTCALL fetchTransformedBilinear(uint *buffer, const Operator *,
                                                        const QSpanData *data, int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    const QList<QRgb> *clut = data->texture.colorTable;
    Q_ASSERT(bpp == QPixelLayout::BPPNone || layout->bpp == bpp);

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) { // scale up on X
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) { // scale down on X less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    fetchTransformedBilinear_simple_scale_helper<blendType>(buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else {
                const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

                Q_DECL_UNINITIALIZED uint buf1[BufferSize];
                Q_DECL_UNINITIALIZED uint buf2[BufferSize];
                uint *b = buffer;
                while (length) {
                    int len = qMin(length, BufferSize / 2);
                    fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, 0);
                    layout->convertToARGB32PM(buf1, len * 2, clut);
                    layout->convertToARGB32PM(buf2, len * 2, clut);

                    if (hasFastInterpolate4() || qAbs(data->m22) < qreal(1./8.)) { // scale up more than 8x (on Y)
                        int disty = (fy & 0x0000ffff) >> 8;
                        for (int i = 0; i < len; ++i) {
                            int distx = (fx & 0x0000ffff) >> 8;
                            b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                            fx += fdx;
                        }
                    } else {
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                        for (int i = 0; i < len; ++i) {
                            uint tl = buf1[i * 2 + 0];
                            uint tr = buf1[i * 2 + 1];
                            uint bl = buf2[i * 2 + 0];
                            uint br = buf2[i * 2 + 1];
                            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                            b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                            fx += fdx;
                        }
                    }
                    length -= len;
                    b += len;
                }
            }
        } else { // rotation or shear
            const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

            Q_DECL_UNINITIALIZED uint buf1[BufferSize];
            Q_DECL_UNINITIALIZED uint buf2[BufferSize];
            uint *b = buffer;
            while (length) {
                int len = qMin(length, BufferSize / 2);
                fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, fdy);
                layout->convertToARGB32PM(buf1, len * 2, clut);
                layout->convertToARGB32PM(buf2, len * 2, clut);

                if (hasFastInterpolate4() || qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.)) {
                    // If we are zooming more than 8 times, we use 8bit precision for the position.
                    for (int i = 0; i < len; ++i) {
                        int distx = (fx & 0x0000ffff) >> 8;
                        int disty = (fy & 0x0000ffff) >> 8;

                        b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                } else {
                    // We are zooming less than 8x, use 4bit precision
                    for (int i = 0; i < len; ++i) {
                        uint tl = buf1[i * 2 + 0];
                        uint tr = buf1[i * 2 + 1];
                        uint bl = buf2[i * 2 + 0];
                        uint br = buf2[i * 2 + 1];

                        int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;

                        b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                }

                length -= len;
                b += len;
            }
        }
    } else {
        const auto fetcher = fetchTransformedBilinear_slow_fetcher<blendType,bpp,uint>;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        Q_DECL_UNINITIALIZED uint buf1[BufferSize];
        Q_DECL_UNINITIALIZED uint buf2[BufferSize];
        uint *b = buffer;

        Q_DECL_UNINITIALIZED ushort distxs[BufferSize / 2];
        Q_DECL_UNINITIALIZED ushort distys[BufferSize / 2];

        while (length) {
            const int len = qMin(length, BufferSize / 2);
            fetcher(buf1, buf2, distxs, distys, len, data->texture, fx, fy, fw, fdx, fdy, fdw);

            layout->convertToARGB32PM(buf1, len * 2, clut);
            layout->convertToARGB32PM(buf2, len * 2, clut);

            for (int i = 0; i < len; ++i) {
                const int distx = distxs[i] >> 8;
                const int disty = distys[i] >> 8;

                b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
            }
            length -= len;
            b += len;
        }
    }

    return buffer;
}